

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_empty_file(char *filename,wchar_t line,char *f1)

{
  int iVar1;
  FILE *__stream;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  FILE *f;
  ssize_t s;
  stat st;
  char buff [1024];
  size_t local_4d0;
  size_t in_stack_fffffffffffffb48;
  size_t in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  ulong local_488;
  undefined1 local_428 [24];
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = stat(in_RDX,(stat *)&stack0xfffffffffffffb48);
  if (iVar1 == 0) {
    if (local_488 == 0) {
      local_4 = L'\x01';
    }
    else {
      failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File should be empty: %s",in_RDX);
      logprintf("    File size: %d\n",local_488 & 0xffffffff);
      logprintf("    Contents:\n");
      __stream = fopen(in_RDX,"rb");
      if (__stream == (FILE *)0x0) {
        logprintf("    Unable to open %s\n",in_RDX);
      }
      else {
        if ((long)local_488 < 0x401) {
          local_4d0 = local_488;
        }
        else {
          local_4d0 = 0x400;
        }
        fread(local_428,1,local_4d0,__stream);
        hexdump(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                in_stack_fffffffffffffb48);
        fclose(__stream);
      }
      failure_finish((void *)0x106729);
      local_4 = L'\0';
    }
  }
  else {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Stat failed: %s",in_RDX);
    failure_finish((void *)0x106607);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_empty_file(const char *filename, int line, const char *f1)
{
	char buff[1024];
	struct stat st;
	ssize_t s;
	FILE *f;

	assertion_count(filename, line);

	if (stat(f1, &st) != 0) {
		failure_start(filename, line, "Stat failed: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	if (st.st_size == 0)
		return (1);

	failure_start(filename, line, "File should be empty: %s", f1);
	logprintf("    File size: %d\n", (int)st.st_size);
	logprintf("    Contents:\n");
	f = fopen(f1, "rb");
	if (f == NULL) {
		logprintf("    Unable to open %s\n", f1);
	} else {
		s = ((off_t)sizeof(buff) < st.st_size) ?
		    (ssize_t)sizeof(buff) : (ssize_t)st.st_size;
		s = fread(buff, 1, s, f);
		hexdump(buff, NULL, s, 0);
		fclose(f);
	}
	failure_finish(NULL);
	return (0);
}